

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O2

void __thiscall LongReadsDatastore::LongReadsDatastore(LongReadsDatastore *this,WorkSpace *ws)

{
  initializer_list<ReadPosSize> __l;
  allocator_type local_41;
  ReadPosSize local_40;
  
  this->ws = ws;
  this->fd = 0;
  local_40.offset = 0;
  local_40.record_size = 0;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::vector
            (&this->read_to_fileRecord,__l,&local_41);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  LongReadsMapper::LongReadsMapper(&this->mapper,&ws->sdg,this,'\x0f',false);
  return;
}

Assistant:

LongReadsDatastore::LongReadsDatastore(WorkSpace &ws) : filename(), ws(ws), mapper(ws.sdg, *this) {
}